

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<unsigned_char> *
testing::internal::ActionResultHolder<unsigned_char>::
PerformDefaultAction<unsigned_char(unsigned_short)>
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *func_mocker,type args,
          string *call_description)

{
  Result value;
  ActionResultHolder<unsigned_char> *this;
  Wrapper local_21;
  string *local_20;
  string *call_description_local;
  type args_local;
  FunctionMockerBase<unsigned_char_(unsigned_short)> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (type)func_mocker;
  this = (ActionResultHolder<unsigned_char> *)operator_new(0x10);
  value = FunctionMockerBase<unsigned_char_(unsigned_short)>::PerformDefaultAction
                    ((FunctionMockerBase<unsigned_char_(unsigned_short)> *)args_local,
                     (type)call_description_local,local_20);
  ReferenceOrValueWrapper<unsigned_char>::ReferenceOrValueWrapper(&local_21,value);
  ActionResultHolder(this,local_21);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        internal::move(args), call_description)));
  }